

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_any_assign_from_any.cpp
# Opt level: O3

int main(void)

{
  bool bVar1;
  bool *pbVar2;
  any local_10;
  
  local_10._value = (erasure *)operator_new(0x10);
  (local_10._value)->_vptr_erasure = (_func_int **)&PTR__erasure_00103d70;
  *(undefined1 *)&local_10._value[1]._vptr_erasure = 1;
  pbVar2 = type::any::as<bool>(&local_10);
  bVar1 = *pbVar2;
  if (local_10._value != (erasure *)0x0) {
    (*(local_10._value)->_vptr_erasure[1])();
  }
  return -(bVar1 ^ 1);
}

Assistant:

int main() {
    try {
      type::any b;
      b = type::any(true);
      if (b.as<bool>()) {
        return 0;
      }
      return -1;
    }
    catch(...) {
      return -1;
    }
}